

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *cmap,
          size_t c,size_t i,size_t *head,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *emitted,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *visited)

{
  pointer pcVar1;
  pointer pcVar2;
  unsigned_long *__args;
  bool bVar3;
  cmGraphEdge *edge;
  pointer pcVar4;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_00;
  bool bVar5;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar6;
  size_t j;
  bool local_62;
  bool local_61;
  size_t local_60;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_58;
  unsigned_long *local_40;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_38;
  
  local_60 = i;
  pVar6 = std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)visited,&local_60);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00480155:
    bVar5 = false;
  }
  else {
    pVar6 = std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)emitted,&local_60);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar1 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = *(pointer *)
                ((long)&pcVar1[local_60].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      local_40 = head;
      local_38 = emitted;
      for (pcVar4 = *(pointer *)
                     &pcVar1[local_60].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          __args = local_40, bVar5 = pcVar4 != pcVar2, bVar5; pcVar4 = pcVar4 + 1) {
        local_58.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pcVar4->Dest;
        if (((cmap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start
             [(long)local_58.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr] == c) && (pcVar4->Strong == true)) {
          local_61 = true;
          local_62 = pcVar4->Cross;
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((this->FinalGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start + local_60),(unsigned_long *)&local_58,
                     &local_61,&local_62,&pcVar4->Backtrace);
          bVar3 = IntraComponent(this,cmap,c,
                                 (size_t)local_58.TopEntry.
                                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,local_40,local_38,visited);
          if (!bVar3) goto LAB_0048014b;
        }
      }
      if (*local_40 == 0xffffffffffffffff) {
        (this->ComponentTail).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[c] = local_60;
      }
      else {
        this_00 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                  ((this->FinalGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                   super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                   super__Vector_impl_data._M_start + local_60);
        local_61 = false;
        local_62 = false;
        local_58.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_58.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_58);
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                  (this_00,__args,&local_61,&local_62,(cmListFileBacktrace *)&local_58);
        if (local_58.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      *__args = local_60;
LAB_0048014b:
      if (bVar5) goto LAB_00480155;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<size_t> const& cmap,
                                            size_t c, size_t i, size_t* head,
                                            std::set<size_t>& emitted,
                                            std::set<size_t>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (cmGraphEdge const& edge : el) {
      size_t j = edge;
      if (cmap[j] == c && edge.IsStrong()) {
        this->FinalGraph[i].emplace_back(j, true, edge.IsCross(),
                                         edge.GetBacktrace());
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head != cmComputeComponentGraph::INVALID_COMPONENT) {
      this->FinalGraph[i].emplace_back(*head, false, false,
                                       cmListFileBacktrace());
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}